

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O0

void __thiscall PointDimensions::test_method(PointDimensions *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_31c;
  undefined8 local_318;
  basic_cstring<const_char> local_310;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_300;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  undefined4 local_2b4;
  undefined8 local_2b0;
  basic_cstring<const_char> local_2a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_298;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  undefined4 local_24c;
  undefined8 local_248;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8 [2];
  Point local_1d8 [8];
  Point p;
  undefined1 local_b0 [8];
  SO3<mnf::ExpMapMatrix> S;
  PointDimensions *this_local;
  
  S.trustMagnitude_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (double)this;
  mnf::SO3<mnf::ExpMapMatrix>::SO3((SO3<mnf::ExpMapMatrix> *)local_b0);
  mnf::Manifold::createRandomPoint(1.0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1f8,0x58,&local_208);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar3,(char (*) [1])0x1c025d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    local_248 = mnf::Point::getDimM();
    local_24c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_230,&local_240,0x58,1,2,&local_248,"p.getDimM()",&local_24c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0x59,&local_270);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_298,plVar3,(char (*) [1])0x1c025d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    local_2b0 = mnf::Point::getTangentDimM();
    local_2b4 = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_298,&local_2a8,0x59,1,2,&local_2b0,"p.getTangentDimM()",&local_2b4,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c8,0x5a,&local_2d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_300,plVar3,(char (*) [1])0x1c025d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    local_318 = mnf::Point::getRepresentationDimM();
    local_31c = 9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&local_300,&local_310,0x5a,1,2,&local_318,"p.getRepresentationDimM()",&local_31c,"9")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::Point::~Point(local_1d8);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3((SO3<mnf::ExpMapMatrix> *)local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointDimensions)
{
  SO3<ExpMapMatrix> S;
  Point p = S.createRandomPoint();
  BOOST_CHECK_EQUAL(p.getDimM(), 3);
  BOOST_CHECK_EQUAL(p.getTangentDimM(), 3);
  BOOST_CHECK_EQUAL(p.getRepresentationDimM(), 9);
}